

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::EnumValueDescriptor::CopyTo
          (EnumValueDescriptor *this,EnumValueDescriptorProto *proto)

{
  int value;
  string *value_00;
  EnumValueOptions *pEVar1;
  EnumValueOptions *pEVar2;
  EnumValueDescriptorProto *proto_local;
  EnumValueDescriptor *this_local;
  
  value_00 = name_abi_cxx11_(this);
  EnumValueDescriptorProto::set_name(proto,value_00);
  value = number(this);
  EnumValueDescriptorProto::set_number(proto,value);
  pEVar1 = options(this);
  pEVar2 = EnumValueOptions::default_instance();
  if (pEVar1 != pEVar2) {
    pEVar1 = EnumValueDescriptorProto::mutable_options(proto);
    pEVar2 = options(this);
    EnumValueOptions::CopyFrom(pEVar1,pEVar2);
  }
  return;
}

Assistant:

void EnumValueDescriptor::CopyTo(EnumValueDescriptorProto* proto) const {
  proto->set_name(name());
  proto->set_number(number());

  if (&options() != &EnumValueOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}